

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

bool chaiscript::Boxed_Number::less_than(Boxed_Number *t_lhs,Boxed_Number *t_rhs)

{
  Result_Type RVar1;
  Boxed_Value *in_RSI;
  undefined8 in_RDI;
  Type_Conversions_State *in_stack_000000e0;
  Boxed_Value *in_stack_000000e8;
  Boxed_Value *in_stack_ffffffffffffffe8;
  
  oper((Opers)((ulong)in_RDI >> 0x20),in_RSI,in_stack_ffffffffffffffe8);
  RVar1 = boxed_cast<bool>(in_stack_000000e8,in_stack_000000e0);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x3af4d8);
  return RVar1;
}

Assistant:

static bool less_than(const Boxed_Number &t_lhs, const Boxed_Number &t_rhs)
      {
        return boxed_cast<bool>(oper(Operators::less_than, t_lhs.bv, t_rhs.bv));
      }